

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

Aig_Obj_t * Fra_LcrCreatePart_rec(Fra_Cla_t *pCla,Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  Aig_Man_t *pNew_local;
  Fra_Cla_t *pCla_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
    if (iVar1 == 0) {
      Aig_ObjSetTravIdCurrent(p,pObj);
      iVar1 = Aig_ObjIsCi(pObj);
      if (iVar1 == 0) {
        pAVar2 = Aig_ObjFanin0(pObj);
        Fra_LcrCreatePart_rec(pCla,pNew,p,pAVar2);
        pAVar2 = Aig_ObjFanin1(pObj);
        Fra_LcrCreatePart_rec(pCla,pNew,p,pAVar2);
        pAVar2 = Aig_ObjChild0Copy(pObj);
        pAVar3 = Aig_ObjChild1Copy(pObj);
        pCla_local = (Fra_Cla_t *)Aig_And(pNew,pAVar2,pAVar3);
        (pObj->field_5).pData = pCla_local;
      }
      else {
        pAVar2 = pCla->pMemRepr[pObj->Id];
        if (pAVar2 == (Aig_Obj_t *)0x0) {
          pAVar2 = Aig_ObjCreateCi(pNew);
          (pObj->field_5).pData = pAVar2;
        }
        else {
          pAVar3 = Fra_LcrCreatePart_rec(pCla,pNew,p,pAVar2);
          (pObj->field_5).pData = pAVar3;
          pAVar2 = Aig_NotCond((Aig_Obj_t *)(pObj->field_5).pData,
                               (uint)(*(ulong *)&pAVar2->field_0x18 >> 3) & 1 ^
                               (uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1);
          (pObj->field_5).pData = pAVar2;
        }
        pCla_local = (Fra_Cla_t *)(pObj->field_5).pData;
      }
    }
    else {
      pCla_local = (Fra_Cla_t *)(pObj->field_5).pData;
    }
    return (Aig_Obj_t *)pCla_local;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraLcr.c"
                ,0x18c,
                "Aig_Obj_t *Fra_LcrCreatePart_rec(Fra_Cla_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)"
               );
}

Assistant:

Aig_Obj_t * Fra_LcrCreatePart_rec( Fra_Cla_t * pCla, Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return (Aig_Obj_t *)pObj->pData;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
//        Aig_Obj_t * pRepr = Fra_ClassObjRepr(pObj);
        Aig_Obj_t * pRepr = pCla->pMemRepr[pObj->Id];
        if ( pRepr == NULL )
            pObj->pData = Aig_ObjCreateCi( pNew );
        else
        {
            pObj->pData = Fra_LcrCreatePart_rec( pCla, pNew, p, pRepr );
            pObj->pData = Aig_NotCond( (Aig_Obj_t *)pObj->pData, pRepr->fPhase ^ pObj->fPhase );
        }
        return (Aig_Obj_t *)pObj->pData;
    }
    Fra_LcrCreatePart_rec( pCla, pNew, p, Aig_ObjFanin0(pObj) );
    Fra_LcrCreatePart_rec( pCla, pNew, p, Aig_ObjFanin1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ));
}